

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O2

Builder * embree::sse2::BVH4SubdivPatch1BuilderSAH(void *bvh,Scene *scene,size_t mode)

{
  BVHNSubdivPatch1BuilderSAH<4> *this;
  
  this = (BVHNSubdivPatch1BuilderSAH<4> *)BVHNSubdivPatch1BuilderSAH<4>::operator_new(0x48);
  BVHNSubdivPatch1BuilderSAH<4>::BVHNSubdivPatch1BuilderSAH(this,(BVH *)bvh,scene);
  return &this->super_Builder;
}

Assistant:

Builder* BVH4SubdivPatch1BuilderSAH(void* bvh, Scene* scene, size_t mode) { return new BVHNSubdivPatch1BuilderSAH<4>((BVH4*)bvh,scene); }